

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O1

void __thiscall Snake::Update(Snake *this,Snake *otherSnake)

{
  SDL_Point prev_cell;
  SDL_Point current_cell;
  SDL_Point local_68;
  SDL_Point local_60;
  Snake local_58;
  
  local_68.x = (int)this->head_x;
  local_68.y = (int)this->head_y;
  UpdateHead(this);
  local_60.x = (int)this->head_x;
  local_60.y = (int)this->head_y;
  if ((local_68.x != local_60.x) || (local_68.y != local_60.y)) {
    local_58.head_x = otherSnake->head_x;
    local_58.head_y = otherSnake->head_y;
    local_58.direction = otherSnake->direction;
    local_58.speed = otherSnake->speed;
    local_58.size = otherSnake->size;
    local_58.alive = otherSnake->alive;
    local_58._13_3_ = *(undefined3 *)&otherSnake->field_0xd;
    std::vector<SDL_Point,_std::allocator<SDL_Point>_>::vector(&local_58.body,&otherSnake->body);
    local_58.grid_height = otherSnake->grid_height;
    local_58.growing = otherSnake->growing;
    local_58._49_3_ = *(undefined3 *)&otherSnake->field_0x31;
    local_58.grid_width = otherSnake->grid_width;
    UpdateBody(this,&local_60,&local_68,&local_58);
    if (local_58.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Snake::Update(Snake otherSnake) {
  SDL_Point prev_cell{
      static_cast<int>(head_x),
      static_cast<int>(
          head_y)};  // We first capture the head's cell before updating.
  UpdateHead();
  SDL_Point current_cell{
      static_cast<int>(head_x),
      static_cast<int>(head_y)};  // Capture the head's cell after updating.

  // Update all of the body vector items if the snake head has moved to a new
  // cell.
  if (current_cell.x != prev_cell.x || current_cell.y != prev_cell.y) {
    UpdateBody(current_cell, prev_cell, otherSnake);
  }
}